

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desc_sroa.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::DescriptorScalarReplacement::GetReplacementVariable
          (DescriptorScalarReplacement *this,Instruction *var,uint32_t idx)

{
  bool bVar1;
  uint32_t uVar2;
  IRContext *context;
  ulong __n;
  pointer ppVar3;
  reference pvVar4;
  pair<std::_Rb_tree_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_bool>
  pVar5;
  allocator<unsigned_int> local_85;
  value_type_conflict2 local_84;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_80;
  pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_68;
  _Base_ptr local_48;
  undefined1 local_40;
  uint32_t local_34;
  iterator iStack_30;
  uint32_t number_of_elements;
  _Self local_28;
  iterator replacement_vars;
  Instruction *pIStack_18;
  uint32_t idx_local;
  Instruction *var_local;
  DescriptorScalarReplacement *this_local;
  
  replacement_vars._M_node._4_4_ = idx;
  pIStack_18 = var;
  var_local = (Instruction *)this;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
       ::find(&this->replacement_variables_,&stack0xffffffffffffffe8);
  iStack_30 = std::
              map<spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::end(&this->replacement_variables_);
  bVar1 = std::operator==(&local_28,&stack0xffffffffffffffd0);
  if (bVar1) {
    context = Pass::context(&this->super_Pass);
    local_34 = descsroautil::GetNumberOfElementsForArrayOrStruct(context,pIStack_18);
    __n = (ulong)local_34;
    local_84 = 0;
    std::allocator<unsigned_int>::allocator(&local_85);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_80,__n,&local_84,&local_85);
    std::
    pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::
    pair<spvtools::opt::Instruction_*&,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_true>
              (&local_68,&stack0xffffffffffffffe8,&local_80);
    pVar5 = std::
            map<spvtools::opt::Instruction_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::less<spvtools::opt::Instruction_*>,_std::allocator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
            ::insert(&this->replacement_variables_,&local_68);
    local_48 = (_Base_ptr)pVar5.first._M_node;
    local_40 = pVar5.second;
    local_28._M_node = local_48;
    std::
    pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::~pair(&local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_80);
    std::allocator<unsigned_int>::~allocator(&local_85);
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator->(&local_28);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&ppVar3->second,(ulong)replacement_vars._M_node._4_4_);
  if (*pvVar4 == 0) {
    uVar2 = CreateReplacementVariable(this,pIStack_18,replacement_vars._M_node._4_4_);
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ::operator->(&local_28);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&ppVar3->second,(ulong)replacement_vars._M_node._4_4_);
    *pvVar4 = uVar2;
  }
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<spvtools::opt::Instruction_*const,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ::operator->(&local_28);
  pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&ppVar3->second,(ulong)replacement_vars._M_node._4_4_);
  return *pvVar4;
}

Assistant:

uint32_t DescriptorScalarReplacement::GetReplacementVariable(Instruction* var,
                                                             uint32_t idx) {
  auto replacement_vars = replacement_variables_.find(var);
  if (replacement_vars == replacement_variables_.end()) {
    uint32_t number_of_elements =
        descsroautil::GetNumberOfElementsForArrayOrStruct(context(), var);
    replacement_vars =
        replacement_variables_
            .insert({var, std::vector<uint32_t>(number_of_elements, 0)})
            .first;
  }

  if (replacement_vars->second[idx] == 0) {
    replacement_vars->second[idx] = CreateReplacementVariable(var, idx);
  }

  return replacement_vars->second[idx];
}